

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu.h
# Opt level: O2

value_type *
basisu::enlarge_vector<basisu::vector<basisu::vector<unsigned_int>>>
          (vector<basisu::vector<unsigned_int>_> *vec,size_t n)

{
  uint uVar1;
  vector<unsigned_int> *pvVar2;
  
  uVar1 = vec->m_size;
  vector<basisu::vector<unsigned_int>_>::resize(vec,n + uVar1,false);
  pvVar2 = vector<basisu::vector<unsigned_int>_>::operator[](vec,(ulong)uVar1);
  return pvVar2;
}

Assistant:

inline bool is_pow2(uint64_t x) { return x && ((x & (x - 1U)) == 0U); }